

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5WriteDlidxGrow(Fts5Index *p,Fts5SegWriter *pWriter,int nLvl)

{
  int in_EAX;
  uint uVar1;
  Fts5DlidxWriter *pFVar2;
  void *pvVar3;
  Fts5DlidxWriter *pFVar4;
  
  if (p->rc != 0) {
    return in_EAX;
  }
  if (pWriter->nDlidx <= nLvl) {
    pFVar4 = pWriter->aDlidx;
    uVar1 = sqlite3_initialize();
    pFVar2 = (Fts5DlidxWriter *)(ulong)uVar1;
    if (uVar1 == 0) {
      pFVar2 = (Fts5DlidxWriter *)sqlite3Realloc(pFVar4,(long)nLvl << 5);
      pFVar4 = pFVar2;
    }
    else {
      pFVar4 = (Fts5DlidxWriter *)0x0;
    }
    in_EAX = (int)pFVar2;
    if (pFVar4 == (Fts5DlidxWriter *)0x0) {
      p->rc = 7;
    }
    else {
      pvVar3 = memset(pFVar4 + pWriter->nDlidx,0,((long)nLvl - (long)pWriter->nDlidx) * 0x20);
      in_EAX = (int)pvVar3;
      pWriter->aDlidx = pFVar4;
      pWriter->nDlidx = nLvl;
    }
  }
  return in_EAX;
}

Assistant:

static int fts5WriteDlidxGrow(
  Fts5Index *p,
  Fts5SegWriter *pWriter,
  int nLvl
){
  if( p->rc==SQLITE_OK && nLvl>=pWriter->nDlidx ){
    Fts5DlidxWriter *aDlidx = (Fts5DlidxWriter*)sqlite3_realloc64(
        pWriter->aDlidx, sizeof(Fts5DlidxWriter) * nLvl
    );
    if( aDlidx==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      size_t nByte = sizeof(Fts5DlidxWriter) * (nLvl - pWriter->nDlidx);
      memset(&aDlidx[pWriter->nDlidx], 0, nByte);
      pWriter->aDlidx = aDlidx;
      pWriter->nDlidx = nLvl;
    }
  }
  return p->rc;
}